

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

void __thiscall xLearn::DMatrix::AddRow(DMatrix *this)

{
  ulong in_RAX;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *local_18;
  
  local_18 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)(in_RAX & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&this->Y,(float *)&local_18);
  local_18 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
             CONCAT44(local_18._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&this->norm,(float *)&local_18);
  local_18 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0;
  std::
  vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>
  ::emplace_back<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>
            ((vector<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*,std::allocator<std::vector<xLearn::Node,std::allocator<xLearn::Node>>*>>
              *)&this->row,&local_18);
  this->row_length = this->row_length + 1;
  return;
}

Assistant:

void AddRow() {
    this->Y.push_back(0);
    this->norm.push_back(1.0);
    this->row.push_back(nullptr);
    row_length++;
  }